

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

pair<unsigned_long,_unsigned_long>
mxx::allreduce<std::pair<unsigned_long,unsigned_long>,pair_sum<unsigned_long,unsigned_long>>
          (undefined8 x,long param_2)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  pair<unsigned_long,_unsigned_long> result;
  custom_op<std::pair<unsigned_long,_unsigned_long>,_true> op;
  
  custom_op<std::pair<unsigned_long,unsigned_long>,true>::
  custom_op<pair_sum<unsigned_long,unsigned_long>>
            ((custom_op<std::pair<unsigned_long,unsigned_long>,true> *)&op);
  result.first = 0;
  result.second = 0;
  MPI_Allreduce(x,&result,1,op.m_type_copy,op.m_op,*(undefined8 *)(param_2 + 8));
  custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::~custom_op(&op);
  pVar1.second = result.second;
  pVar1.first = result.first;
  return pVar1;
}

Assistant:

inline T allreduce(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get custom op (and type for custom op)
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Allreduce(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    return result;
}